

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O3

MultiJittered * __thiscall pm::World::createSampler<pm::MultiJittered,int>(World *this,int *args)

{
  tuple<pm::Sampler_*,_std::default_delete<pm::Sampler>_> this_00;
  __uniq_ptr_impl<pm::Sampler,_std::default_delete<pm::Sampler>_> local_20;
  
  this_00.super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
  super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>)operator_new(0x88);
  MultiJittered::MultiJittered
            ((MultiJittered *)
             this_00.super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
             super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl,*args);
  local_20._M_t.super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
  super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl =
       (tuple<pm::Sampler_*,_std::default_delete<pm::Sampler>_>)
       (tuple<pm::Sampler_*,_std::default_delete<pm::Sampler>_>)
       this_00.super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
       super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>,std::allocator<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>>>
  ::emplace_back<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>>
            ((vector<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>,std::allocator<std::unique_ptr<pm::Sampler,std::default_delete<pm::Sampler>>>>
              *)&this->samplers_,
             (unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_> *)&local_20);
  if ((_Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>)
      local_20._M_t.super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
      super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl != (Sampler *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
                          super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl + 8))();
  }
  return (MultiJittered *)
         (this->samplers_).
         super__Vector_base<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>,_std::allocator<std::unique_ptr<pm::Sampler,_std::default_delete<pm::Sampler>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
         super___uniq_ptr_impl<pm::Sampler,_std::default_delete<pm::Sampler>_>._M_t.
         super__Tuple_impl<0UL,_pm::Sampler_*,_std::default_delete<pm::Sampler>_>.
         super__Head_base<0UL,_pm::Sampler_*,_false>._M_head_impl;
}

Assistant:

T *World::createSampler(Args &&... args)
{
	samplers_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(samplers_.back().get());
}